

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O0

bool __thiscall CMDPSTATE::AddPred(CMDPSTATE *this,int stateID)

{
  bool bVar1;
  int in_ESI;
  CMDPSTATE *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  bVar1 = ContainsPred(in_RDI,in_ESI);
  if (!bVar1) {
    std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,&in_RDI->StateID);
  }
  return true;
}

Assistant:

bool CMDPSTATE::AddPred(int stateID)
{
    //add the predecessor
    if (!ContainsPred(stateID)) {
#if MEM_CHECK
        DisableMemCheck();
#endif

        PredsID.push_back(stateID);
#if MEM_CHECK
        EnableMemCheck();
#endif
    }

    return true;
}